

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O0

void __thiscall CConsoleNetConnection::Disconnect(CConsoleNetConnection *this,char *pReason)

{
  long lVar1;
  undefined4 uVar2;
  NETSOCKET sock;
  int iVar3;
  char *in_RSI;
  CConsoleNetConnection *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 uStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = State(in_RDI);
  if (iVar3 != 0) {
    if ((in_RSI != (char *)0x0) && (*in_RSI != '\0')) {
      Send((CConsoleNetConnection *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
           (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    uVar2 = (in_RDI->m_Socket).ipv4sock;
    sock.ipv4sock = (in_RDI->m_Socket).ipv6sock;
    sock.type = uVar2;
    sock.ipv6sock = in_stack_ffffffffffffffe8;
    net_tcp_close(sock);
    Reset(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConsoleNetConnection::Disconnect(const char *pReason)
{
	if(State() == NET_CONNSTATE_OFFLINE)
		return;

	if(pReason && pReason[0])
		Send(pReason);

	net_tcp_close(m_Socket);

	Reset();
}